

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O2

void __thiscall
ft::multimap<int,_float,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_>::clear
          (multimap<int,_float,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_> *this)

{
  iterator local_38;
  iterator local_20;
  
  local_38.m_tree =
       &(this->super_mapBase<int,_float,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_>
        ).
        super_treeBase<int,_float,_ft::pair<const_int,_float>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_>
        .m_tree;
  local_38.m_node =
       ((this->super_mapBase<int,_float,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_>
        ).
        super_treeBase<int,_float,_ft::pair<const_int,_float>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_>
        .m_tree.m_first)->parent;
  local_38._vptr_treeIterator = (_func_int **)&PTR__treeIterator_00118a80;
  local_20.m_node =
       (this->super_mapBase<int,_float,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_>)
       .
       super_treeBase<int,_float,_ft::pair<const_int,_float>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_>
       .m_tree.m_last;
  local_20._vptr_treeIterator = (_func_int **)&PTR__treeIterator_00118a80;
  local_20.m_tree = local_38.m_tree;
  erase(this,&local_38,&local_20);
  return;
}

Assistant:

void clear() {
		this->erase(this->begin(), this->end());
	}